

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall soplex::SVSetBase<double>::ensureMem(SVSetBase<double> *this,int n,bool shortenLast)

{
  int iVar1;
  int iVar2;
  DLPSV *pDVar3;
  byte in_DL;
  int in_ESI;
  SVSetBase<double> *in_RDI;
  double dVar4;
  int newMax;
  int missingMem;
  int unusedPsMem;
  DLPSV *ps;
  int in_stack_ffffffffffffffac;
  SVSetBase<double> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc8;
  int newmax;
  
  newmax = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  iVar1 = memSize((SVSetBase<double> *)0x22e7d4);
  iVar2 = memMax((SVSetBase<double> *)0x22e7e6);
  if (iVar2 < iVar1 + in_ESI) {
    pDVar3 = IdList<soplex::SVSetBase<double>::DLPSV>::last(&in_RDI->list);
    if ((pDVar3 != (DLPSV *)0x0) && ((in_DL & 1) != 0)) {
      pDVar3 = IdList<soplex::SVSetBase<double>::DLPSV>::last(&in_RDI->list);
      iVar1 = SVectorBase<double>::max(&pDVar3->super_SVectorBase<double>);
      iVar2 = SVectorBase<double>::size(&pDVar3->super_SVectorBase<double>);
      ClassArray<soplex::Nonzero<double>_>::removeLast
                (&in_RDI->super_ClassArray<soplex::Nonzero<double>_>,iVar1 - iVar2);
      iVar1 = SVectorBase<double>::size(&pDVar3->super_SVectorBase<double>);
      SVectorBase<double>::set_max(&pDVar3->super_SVectorBase<double>,iVar1);
      newmax = (int)((ulong)pDVar3 >> 0x20);
      updateUnusedMemEstimation(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    }
    iVar1 = memSize((SVSetBase<double> *)0x22e88f);
    iVar2 = memMax((SVSetBase<double> *)0x22e8a1);
    iVar2 = (iVar1 + in_ESI) - iVar2;
    if ((0 < iVar2) && (iVar2 <= in_RDI->unusedMem)) {
      iVar1 = in_RDI->unusedMem;
      dVar4 = (in_RDI->super_ClassArray<soplex::Nonzero<double>_>).memFactor - 1.0;
      iVar2 = memMax((SVSetBase<double> *)0x22e8ee);
      if (dVar4 * (double)iVar2 < (double)iVar1) {
        memPack(in_RDI);
      }
    }
    iVar1 = memSize((SVSetBase<double> *)0x22e91c);
    iVar1 = iVar1 + in_ESI;
    iVar2 = memMax((SVSetBase<double> *)0x22e92e);
    if (iVar2 < iVar1) {
      dVar4 = (in_RDI->super_ClassArray<soplex::Nonzero<double>_>).memFactor;
      iVar1 = memMax((SVSetBase<double> *)0x22e94d);
      iVar2 = memSize((SVSetBase<double> *)0x22e96d);
      if ((int)(dVar4 * (double)iVar1) < iVar2 + in_ESI) {
        memSize((SVSetBase<double> *)0x22e981);
      }
      memRemax(in_RDI,newmax);
    }
  }
  return;
}

Assistant:

void ensureMem(int n, bool shortenLast = true)
   {
      if(memSize() + n <= memMax())
         return;

      if(list.last() && shortenLast)
      {
         // get last vector and compute its unused memory
         DLPSV* ps = list.last();
         int unusedPsMem = ps->max() - ps->size();
         assert(unusedPsMem >= 0);

         // return vector's unused memory to common memory
         SVSetBaseArray::removeLast(unusedPsMem);
         ps->set_max(ps->size());

         // decrease counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "ensureMem, this = {} : updateUnusedMemEstimation -= {}\n", (void*)this,
                       unusedPsMem);
#endif
         updateUnusedMemEstimation(-unusedPsMem);
      }

      // if the missing memory can be acquired by packing the memory, we prefer this to allocating new memory
      int missingMem = (memSize() + n - memMax());

      ///@todo use an independent parameter "memwastefactor" here
      if(missingMem > 0 && missingMem <= unusedMem
            && unusedMem > (SVSetBaseArray::memFactor - 1.0) * memMax())
         memPack();

      // if the unused memory was overestimated and packing did not help, we need to reallocate
      if(memSize() + n > memMax())
      {
         int newMax = int(SVSetBaseArray::memFactor * memMax());

         if(memSize() + n > newMax)
            newMax = memSize() + n;

         memRemax(newMax);
      }
   }